

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

reporterMap * doctest::anon_unknown_14::getListeners(void)

{
  int iVar1;
  
  if ((anonymous_namespace)::getListeners()::data == '\0') {
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::getListeners()::data);
    if (iVar1 != 0) {
      std::
      map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
      ::map(&getListeners::data);
      __cxa_atexit(std::
                   map<std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&),_std::less<std::pair<int,_doctest::String>_>,_std::allocator<std::pair<const_std::pair<int,_doctest::String>,_doctest::IReporter_*(*)(const_doctest::ContextOptions_&)>_>_>
                   ::~map,&getListeners::data,&__dso_handle);
      __cxa_guard_release(&(anonymous_namespace)::getListeners()::data);
    }
  }
  return &getListeners::data;
}

Assistant:

reporterMap& getListeners() {
        static reporterMap data;
        return data;
    }